

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawCircleGradient(int centerX,int centerY,float radius,Color color1,Color color2)

{
  float fVar1;
  float fVar2;
  undefined4 local_20;
  int i;
  float radius_local;
  int centerY_local;
  int centerX_local;
  Color color2_local;
  Color color1_local;
  
  rlCheckRenderBatchLimit(0x6c);
  rlBegin(4);
  for (local_20 = 0; local_20 < 0x168; local_20 = local_20 + 10) {
    centerX_local._0_1_ = color1.r;
    centerX_local._1_1_ = color1.g;
    centerX_local._2_1_ = color1.b;
    centerX_local._3_1_ = color1.a;
    rlColor4ub((uchar)centerX_local,centerX_local._1_1_,centerX_local._2_1_,centerX_local._3_1_);
    rlVertex2f((float)centerX,(float)centerY);
    centerY_local._0_1_ = color2.r;
    centerY_local._1_1_ = color2.g;
    centerY_local._2_1_ = color2.b;
    centerY_local._3_1_ = color2.a;
    rlColor4ub((uchar)centerY_local,centerY_local._1_1_,centerY_local._2_1_,centerY_local._3_1_);
    fVar1 = sinf((float)local_20 * 0.017453292);
    fVar2 = cosf((float)local_20 * 0.017453292);
    rlVertex2f(fVar1 * radius + (float)centerX,fVar2 * radius + (float)centerY);
    rlColor4ub((uchar)centerY_local,centerY_local._1_1_,centerY_local._2_1_,centerY_local._3_1_);
    fVar1 = sinf((float)(local_20 + 10) * 0.017453292);
    fVar2 = cosf((float)(local_20 + 10) * 0.017453292);
    rlVertex2f(fVar1 * radius + (float)centerX,fVar2 * radius + (float)centerY);
  }
  rlEnd();
  return;
}

Assistant:

void DrawCircleGradient(int centerX, int centerY, float radius, Color color1, Color color2)
{
    rlCheckRenderBatchLimit(3*36);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color1.r, color1.g, color1.b, color1.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*i)*radius, (float)centerY + cosf(DEG2RAD*i)*radius);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*(i + 10))*radius, (float)centerY + cosf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}